

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Abc_NtkComputePaths(Abc_Ntk_t *p)

{
  uint uVar1;
  Acb_Ntk_t *p_00;
  
  p_00 = Acb_NtkFromAbc(p);
  Acb_NtkCreateFanout(p_00);
  Acb_NtkCleanObjCounts(p_00);
  uVar1 = Acb_NtkComputePaths(p_00);
  printf("Computed %d paths.\n",(ulong)uVar1);
  Acb_NtkPrintPaths(p_00);
  Acb_ManFree(p_00->pDesign);
  return;
}

Assistant:

void Abc_NtkComputePaths( Abc_Ntk_t * p )
{
    extern Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p );
    Acb_Ntk_t * pNtk = Acb_NtkFromAbc( p );
    Acb_NtkCreateFanout( pNtk );
    Acb_NtkCleanObjCounts( pNtk );
    printf( "Computed %d paths.\n", Acb_NtkComputePaths(pNtk) );
    Acb_NtkPrintPaths( pNtk );
    Acb_ManFree( pNtk->pDesign );
}